

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

bool __thiscall
cfd::core::KeyFormatData::IsFindFormatType(KeyFormatData *this,Bip32FormatType format_type)

{
  const_reference cVar1;
  
  if (format_type < (kBip84|kBip49)) {
    cVar1 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&this->has_format_,(ulong)format_type);
    return cVar1;
  }
  return false;
}

Assistant:

bool KeyFormatData::IsFindFormatType(Bip32FormatType format_type) const {
  switch (format_type) {
    case kNormal:
    case kBip49:
    case kBip84:
      return (has_format_[format_type]);
    default:
      return false;
  }
}